

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O3

int * Gia_SortFloats(float *pArray,int *pPerm,int nSize)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (pPerm == (int *)0x0) {
    pPerm = (int *)malloc((long)nSize * 4);
    auVar1 = _DAT_0093d220;
    if (0 < nSize) {
      lVar2 = (ulong)(uint)nSize - 1;
      auVar4._8_4_ = (int)lVar2;
      auVar4._0_8_ = lVar2;
      auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
      uVar3 = 0;
      auVar4 = auVar4 ^ _DAT_0093d220;
      auVar5 = _DAT_0093d210;
      do {
        auVar6 = auVar5 ^ auVar1;
        if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                    auVar4._4_4_ < auVar6._4_4_) & 1)) {
          pPerm[uVar3] = (int)uVar3;
        }
        if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
            auVar6._12_4_ <= auVar4._12_4_) {
          pPerm[uVar3 + 1] = (int)uVar3 + 1;
        }
        uVar3 = uVar3 + 2;
        lVar2 = auVar5._8_8_;
        auVar5._0_8_ = auVar5._0_8_ + 2;
        auVar5._8_8_ = lVar2 + 2;
      } while ((nSize + 1U & 0xfffffffe) != uVar3);
    }
  }
  sort_rec3(pArray,pPerm,nSize);
  return pPerm;
}

Assistant:

int * Gia_SortFloats( float * pArray, int * pPerm, int nSize )
{
    int i;
    if ( pPerm == NULL )
    {
        pPerm = ABC_ALLOC( int, nSize );
        for ( i = 0; i < nSize; i++ )
            pPerm[i] = i;
    }
    minisat_sort3( pArray, pPerm, nSize );
//    for ( i = 1; i < nSize; i++ )
//        assert( pArray[i-1] <= pArray[i] );
    return pPerm;
}